

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::allowed_actions_to_label
               (search_private *priv,size_t ec_cnt,action *allowed_actions,
               size_t allowed_actions_cnt,float *allowed_actions_cost,action *oracle_actions,
               size_t oracle_actions_cnt,polylabel *lab)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  ulong in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint *in_R9;
  ulong in_stack_00000008;
  action k_7;
  size_t i;
  float w;
  action k_6;
  action k_5;
  action k_4;
  bool set_to_one;
  action k_3;
  action k_2;
  action k_1;
  action k;
  bool isCB;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  bool bVar4;
  polylabel *in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  float value;
  uint32_t in_stack_ffffffffffffff64;
  undefined1 isCB_00;
  polylabel *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  ulong local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  
  bVar1 = *(byte *)(in_RDI + 0x68);
  bVar4 = SUB41((uint)in_stack_ffffffffffffff54 >> 0x18,0);
  if ((*(byte *)(in_RDI + 0x13) & 1) == 0) {
    if ((*(byte *)(in_RDI + 0x14) & 1) == 0) {
      if ((in_RDX == 0) || (in_RCX == 0)) {
        bVar2 = false;
        sVar3 = cs_get_costs_size(bVar4,(polylabel *)
                                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ));
        if (sVar3 != *(size_t *)(in_RDI + 0x58)) {
          cs_costs_erase(SUB41((uint)in_stack_ffffffffffffff54 >> 0x18,0),
                         (polylabel *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
          ;
          for (local_4c = 0; (ulong)local_4c < *(ulong *)(in_RDI + 0x58); local_4c = local_4c + 1) {
            cs_cost_push_back(SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
                              in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                              in_stack_ffffffffffffff60);
          }
          bVar2 = true;
        }
        isCB_00 = (undefined1)(in_stack_ffffffffffffff64 >> 0x18);
        if (in_stack_00000008 < 2) {
          if (!bVar2) {
            for (local_50 = 0; isCB_00 = (undefined1)(in_stack_ffffffffffffff64 >> 0x18),
                (ulong)local_50 < *(ulong *)(in_RDI + 0x58); local_50 = local_50 + 1) {
              cs_set_cost_loss((bool)isCB_00,in_stack_ffffffffffffff58,
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff4c);
            }
          }
          if (in_stack_00000008 == 1) {
            cs_set_cost_loss((bool)isCB_00,in_stack_ffffffffffffff58,
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff4c);
          }
        }
        else {
          for (local_54 = 0; (ulong)local_54 < *(ulong *)(in_RDI + 0x58); local_54 = local_54 + 1) {
            bVar4 = (bool)(bVar1 & 1);
            array_contains<unsigned_int>(local_54 + 1,in_R9,in_stack_00000008);
            cs_set_cost_loss(bVar4,in_stack_ffffffffffffff58,
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff4c);
          }
        }
      }
      else {
        cs_costs_erase(bVar4,(polylabel *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        for (local_60 = 0; local_60 < in_RCX; local_60 = local_60 + 1) {
          value = *(float *)(in_RDX + local_60 * 4);
          array_contains<unsigned_int>((uint)value,in_R9,in_stack_00000008);
          cs_cost_push_back(SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
                            in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,value);
        }
      }
    }
    else if (in_RDX == 0) {
      sVar3 = cs_get_costs_size(bVar4,(polylabel *)
                                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
      ;
      if (sVar3 != *(size_t *)(in_RDI + 0x58)) {
        cs_costs_erase(SUB41((uint)in_stack_ffffffffffffff54 >> 0x18,0),
                       (polylabel *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        for (local_3c = 0; (ulong)local_3c < *(ulong *)(in_RDI + 0x58); local_3c = local_3c + 1) {
          cs_cost_push_back(SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
                            in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                            in_stack_ffffffffffffff60);
        }
      }
      for (local_40 = 0; (ulong)local_40 < *(ulong *)(in_RDI + 0x58); local_40 = local_40 + 1) {
        cs_set_cost_loss(SUB41(in_stack_ffffffffffffff64 >> 0x18,0),in_stack_ffffffffffffff58,
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff4c);
      }
    }
    else {
      cs_costs_erase(bVar4,(polylabel *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      for (local_44 = 0; local_44 < in_RCX; local_44 = local_44 + 1) {
        cs_cost_push_back(SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
                          in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                          in_stack_ffffffffffffff60);
      }
    }
  }
  else {
    cs_costs_erase(bVar4,(polylabel *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
    ;
    for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
      array_contains<unsigned_int>(local_38,in_R9,in_stack_00000008);
      cs_cost_push_back(SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),in_stack_ffffffffffffff68,
                        in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    }
  }
  return;
}

Assistant:

void allowed_actions_to_label(search_private& priv, size_t ec_cnt, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost, const action* oracle_actions,
    size_t oracle_actions_cnt, polylabel& lab)
{
  bool isCB = priv.cb_learner;
  if (priv.is_ldf)  // LDF version easier
  {
    cs_costs_erase(isCB, lab);
    for (action k = 0; k < ec_cnt; k++)
      cs_cost_push_back(isCB, lab, k, array_contains<action>(k, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f);
    // cerr << "lab = ["; for (size_t i=0; i<lab.cs.costs.size(); i++) cdbg << ' ' << lab.cs.costs[i].class_index << ':'
    // << lab.cs.costs[i].x; cdbg << " ]" << endl;
  }
  else if (priv.use_action_costs)
  {
    // TODO: Weight
    if (allowed_actions == nullptr)
    {
      if (cs_get_costs_size(isCB, lab) != priv.A)
      {
        cs_costs_erase(isCB, lab);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, lab, k + 1, 0.);
      }
      for (action k = 0; k < priv.A; k++) cs_set_cost_loss(isCB, lab, k, allowed_actions_cost[k]);
    }
    else  // manually specified actions
    {
      cs_costs_erase(isCB, lab);
      for (action k = 0; k < allowed_actions_cnt; k++)
        cs_cost_push_back(isCB, lab, allowed_actions[k], allowed_actions_cost[k]);
    }
  }
  else  // non-LDF, no action costs
  {
    if ((allowed_actions == nullptr) || (allowed_actions_cnt == 0))  // any action is allowed
    {
      bool set_to_one = false;
      if (cs_get_costs_size(isCB, lab) != priv.A)
      {
        cs_costs_erase(isCB, lab);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, lab, k + 1, 1.);
        set_to_one = true;
      }
      // cerr << "lab = ["; for (size_t i=0; i<lab.cs.costs.size(); i++) cdbg << ' ' << lab.cs.costs[i].class_index <<
      // ':' << lab.cs.costs[i].x; cdbg << " ]" << endl;
      if (oracle_actions_cnt <= 1)  // common case to speed up
      {
        if (!set_to_one)
          for (action k = 0; k < priv.A; k++) cs_set_cost_loss(isCB, lab, k, 1.);
        if (oracle_actions_cnt == 1)
          cs_set_cost_loss(isCB, lab, oracle_actions[0] - 1, 0.);
      }
      else
      {
        for (action k = 0; k < priv.A; k++)
          cs_set_cost_loss(isCB, lab, k, array_contains<action>(k + 1, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f);
      }
    }
    else  // only some actions are allowed
    {
      cs_costs_erase(isCB, lab);
      float w = 1.;  // array_contains<action>(3, oracle_actions, oracle_actions_cnt) ? 5.f : 1.f;
      for (size_t i = 0; i < allowed_actions_cnt; i++)
      {
        action k = allowed_actions[i];
        cs_cost_push_back(
            isCB, lab, k, (array_contains<action>(k, oracle_actions, oracle_actions_cnt)) ? 0.f : w);  // 1.f );
      }
    }
  }
}